

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O3

entry_type __thiscall fasttext::Dictionary::getType(Dictionary *this,string_view w)

{
  element_type *peVar1;
  size_type sVar2;
  basic_string_view<char,_std::char_traits<char>_> local_10;
  
  local_10._M_str = w._M_str;
  local_10._M_len = w._M_len;
  peVar1 = (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::find
                    (&local_10,(peVar1->label)._M_dataplus._M_p,0,(peVar1->label)._M_string_length);
  return sVar2 == 0;
}

Assistant:

entry_type Dictionary::getType(const std::string_view w) const {
  return (w.find(args_->label) == 0) ? entry_type::label : entry_type::word;
}